

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

void __thiscall slang::ast::Scope::addDeferredMembers(Scope *this,SyntaxNode *syntax)

{
  SyntaxKind SVar1;
  uint uVar2;
  pointer ppVar3;
  Symbol *pSVar4;
  long lVar5;
  BumpAllocator *this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar6;
  int iVar7;
  Symbol *pSVar8;
  DeferredMemberData *this_01;
  SyntaxNode *pSVar9;
  size_t sVar10;
  SourceLocation location;
  Diagnostic *this_02;
  WildcardImportSymbol *item;
  Symbol *pSVar11;
  string_view __y;
  SourceLocation SStack_60;
  string_view sStack_58;
  Symbol *pSStack_48;
  
  pSVar8 = (Symbol *)BumpAllocator::allocate(&this->compilation->super_BumpAllocator,0x48,8);
  pSVar8->kind = DeferredMember;
  (pSVar8->name)._M_len = 0;
  (pSVar8->name)._M_str = "";
  pSVar8->originatingSyntax = (SyntaxNode *)0x0;
  pSVar8->location = (SourceLocation)0x0;
  pSVar8->parentScope = (Scope *)0x0;
  *(undefined8 *)((long)&pSVar8->parentScope + 4) = 0;
  *(undefined8 *)((long)&pSVar8->nextInScope + 4) = 0;
  *(SyntaxNode **)(pSVar8 + 1) = syntax;
  addMember(this,pSVar8);
  this_01 = getOrAddDeferredData(this);
  pSVar11 = pSVar8;
  DeferredMemberData::addMember(this_01,pSVar8);
  SVar1 = syntax->kind;
  iVar7 = 1;
  if (SVar1 - CheckerInstantiation < 10) {
    uVar2 = (&switchD_0073121d::switchdataD_008f7854)[SVar1 - CheckerInstantiation];
    switch(SVar1) {
    case CheckerInstantiation:
      pSVar9 = *(SyntaxNode **)(syntax + 6);
      break;
    default:
      ppVar3 = (this_01->portDecls).
               super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSStack_48 = pSVar8;
      if (ppVar3 == (pointer)0x0) {
LAB_00731333:
        this_00 = (BumpAllocator *)
                  (this_01->members).
                  super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        sStack_58 = parsing::Token::valueText((Token *)&pSVar11->location);
        SStack_60 = parsing::Token::location((Token *)&pSVar11->originatingSyntax);
        item = BumpAllocator::
               emplace<slang::ast::WildcardImportSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         (this_00,&sStack_58,&SStack_60);
        (item->super_Symbol).originatingSyntax = (SyntaxNode *)pSVar11;
        syntax_00._M_extent._M_extent_value = (size_t)&switchD_0073121d::switchdataD_008f7854;
        syntax_00._M_ptr =
             (pointer)((long)&switchD_0073121d::switchdataD_008f7854 + (long)(int)uVar2);
        Symbol::setAttributes(&item->super_Symbol,(Scope *)this_01,syntax_00);
        addMember((Scope *)this_01,&item->super_Symbol);
        addWildcardImport((Scope *)this_01,item);
      }
      else {
        pSVar8 = (Symbol *)ppVar3->first;
        pSVar4 = ppVar3->second;
        do {
          if (pSVar8 == pSVar4) goto LAB_00731333;
          lVar5 = *(long *)pSVar8;
          __x = *(basic_string_view<char,_std::char_traits<char>_> *)(lVar5 + 0x40);
          __y = parsing::Token::valueText((Token *)&pSVar11->location);
          bVar6 = std::operator==(__x,__y);
          pSVar8 = (Symbol *)&pSVar8->name;
        } while (!bVar6);
        if (*(long *)(lVar5 + 0x40) != 0) {
          location = parsing::Token::location((Token *)&pSVar11->originatingSyntax);
          this_02 = addDiag((Scope *)this_01,(DiagCode)0x41000a,location);
          Diagnostic::addNote(this_02,(DiagCode)0xa0001,*(SourceLocation *)(lVar5 + 0x18));
          return;
        }
      }
      return;
    case ClassMethodDeclaration:
    case ClockingDeclaration:
      goto switchD_0073121d_caseD_49;
    case ClockingItem:
switchD_0073121d_caseD_50:
      pSVar9 = syntax[5].previewNode;
      goto LAB_00731268;
    }
  }
  else {
    if (SVar1 == AnsiPortList) {
LAB_00731236:
      pSVar9 = syntax[3].previewNode;
LAB_00731268:
      iVar7 = (int)((ulong)((long)&pSVar9->kind + 1U) >> 1);
      goto switchD_0073121d_caseD_49;
    }
    if (SVar1 == BindDirective) goto switchD_0073121d_caseD_49;
    if (SVar1 == CaseGenerate) {
LAB_0073124e:
      sVar10 = countGenMembers(syntax);
      iVar7 = (int)sVar10;
      goto switchD_0073121d_caseD_49;
    }
    if (SVar1 != ContinuousAssign) {
      if (SVar1 != CoverCross) {
        if (SVar1 == DataDeclaration) {
          pSVar9 = *(SyntaxNode **)(syntax + 8);
          goto LAB_00731268;
        }
        if ((((SVar1 == DefaultClockingReference) || (SVar1 == DefaultDisableDeclaration)) ||
            (SVar1 == EnumType)) || (SVar1 == GenerateBlock)) goto switchD_0073121d_caseD_49;
        if (SVar1 != SpecifyBlock) {
          if (SVar1 == IfGenerate) goto LAB_0073124e;
          if (SVar1 == LoopGenerate) goto switchD_0073121d_caseD_49;
          if (SVar1 == ModportDeclaration) {
            pSVar9 = *(SyntaxNode **)(syntax + 6);
            goto LAB_00731268;
          }
          if (SVar1 == ModuleDeclaration) goto switchD_0073121d_caseD_49;
          if (SVar1 != NetAlias) {
            if (SVar1 == NonAnsiPortList) goto LAB_00731236;
            if (SVar1 == PortDeclaration) goto switchD_0073121d_caseD_50;
            if (SVar1 != PrimitiveInstantiation) {
              if (SVar1 == ProgramDeclaration) goto switchD_0073121d_caseD_49;
              pSVar9 = syntax[6].parent;
              goto LAB_00731243;
            }
            goto LAB_0073123c;
          }
        }
      }
      iVar7 = 2;
      goto switchD_0073121d_caseD_49;
    }
LAB_0073123c:
    pSVar9 = syntax[6].previewNode;
  }
LAB_00731243:
  iVar7 = (int)((ulong)((long)&pSVar9->kind + 1U) >> 1) + 1;
switchD_0073121d_caseD_49:
  pSVar8->indexInScope = pSVar8->indexInScope + iVar7;
  return;
}

Assistant:

void Scope::addDeferredMembers(const SyntaxNode& syntax) {
    auto sym = compilation.emplace<DeferredMemberSymbol>(syntax);
    addMember(*sym);
    getOrAddDeferredData().addMember(sym);

    // We need to figure out how many new symbols could be inserted when we
    // later elaborate this deferred member, so that we can make room in the
    // index space such that no symbols need to overlap.
    sym->indexInScope += (uint32_t)countMembers(syntax);
}